

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

bool ImGui::IsRectVisible(ImVec2 *rect_min,ImVec2 *rect_max)

{
  float *pfVar1;
  float fVar2;
  ImGuiWindow *pIVar3;
  
  pIVar3 = GImGui->CurrentWindow;
  fVar2 = (pIVar3->ClipRect).Max.y;
  if (((rect_min->y <= fVar2 && fVar2 != rect_min->y) &&
      (pfVar1 = &(pIVar3->ClipRect).Min.y, *pfVar1 <= rect_max->y && rect_max->y != *pfVar1)) &&
     (fVar2 = (pIVar3->ClipRect).Max.x, rect_min->x <= fVar2 && fVar2 != rect_min->x)) {
    return (pIVar3->ClipRect).Min.x <= rect_max->x && rect_max->x != (pIVar3->ClipRect).Min.x;
  }
  return false;
}

Assistant:

bool ImGui::IsRectVisible(const ImVec2& rect_min, const ImVec2& rect_max)
{
    ImGuiWindow* window = GImGui->CurrentWindow;
    return window->ClipRect.Overlaps(ImRect(rect_min, rect_max));
}